

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void run_game_loop(void)

{
  wchar_t wVar1;
  player_upkeep *ppVar2;
  int iVar3;
  uint uVar4;
  
  process_player_cleanup();
  if (player->upkeep->playing != true) goto LAB_00145b39;
  process_player();
  wVar1 = player->upkeep->energy_use;
  while( true ) {
    if (wVar1 == L'\0') {
      return;
    }
LAB_00145b39:
    if ((int)player->energy < (int)(uint)z_info->move_energy) break;
    event_signal(EVENT_ANIMATE);
    process_monsters(player->energy + L'\x01');
    if (((player->is_dead != false) || (player->upkeep->playing != true)) ||
       (player->upkeep->generate_level != false)) break;
    process_player();
    wVar1 = player->upkeep->energy_use;
  }
  notice_stuff(player);
  handle_stuff(player);
  event_signal(EVENT_REFRESH);
  if (player->is_dead != false) {
    return;
  }
  do {
    if (player->upkeep->playing != true) {
      return;
    }
    if (player->upkeep->generate_level == false) {
      process_monsters(L'\0');
      reset_monsters();
      notice_stuff(player);
      handle_stuff(player);
      event_signal(EVENT_REFRESH);
      if (player->is_dead != false) {
        return;
      }
      if (player->upkeep->playing != true) {
        return;
      }
      uVar4 = turn * -0x33333333 + 0x19999998;
      if (((uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x19999999) &&
         (player->upkeep->generate_level == false)) {
        process_world((chunk *)cave);
        notice_stuff(player);
        handle_stuff(player);
        event_signal(EVENT_REFRESH);
        if (player->is_dead != false) {
          return;
        }
        if (player->upkeep->playing != true) {
          return;
        }
      }
      player->energy =
           player->energy +
           (short)((ulong)((uint)z_info->move_energy *
                          (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                                [(player->state).speed]) * 0x28f5c29 >> 0x20);
      turn = turn + 1;
    }
    if (player->upkeep->generate_level == true) {
      if (character_dungeon == true) {
        player_clear_timed(player,L',',false,false);
        cmd_disable_repeat_floor_item();
        notice_stuff(player);
        update_stuff(player);
        redraw_stuff(player);
        event_signal(EVENT_MESSAGE_FLUSH);
        if (cave->name != (char *)0x0) {
          iVar3 = strcmp(cave->name,"arena");
          prepare_next_level(player);
          on_new_level();
          ppVar2 = player->upkeep;
          ppVar2->generate_level = false;
          if (iVar3 == 0) {
            ppVar2->arena_level = false;
            if ((monster_conflict *)ppVar2->health_who != (monster_conflict *)0x0) {
              kill_arena_monster((monster_conflict *)ppVar2->health_who);
            }
          }
          goto LAB_00145d98;
        }
      }
      prepare_next_level(player);
      on_new_level();
      player->upkeep->generate_level = false;
    }
LAB_00145d98:
    while ((int)(uint)z_info->move_energy <= (int)player->energy) {
      event_signal(EVENT_ANIMATE);
      process_monsters(player->energy + L'\x01');
      if (((player->is_dead != false) || (player->upkeep->playing != true)) ||
         (player->upkeep->generate_level != false)) break;
      process_player();
      if (player->upkeep->energy_use == L'\0') {
        return;
      }
    }
    notice_stuff(player);
    handle_stuff(player);
    event_signal(EVENT_REFRESH);
    if (player->is_dead == true) {
      return;
    }
  } while( true );
}

Assistant:

void run_game_loop(void)
{
	/* Tidy up after the player's command */
	process_player_cleanup();

	/* Keep processing the player until they use some energy or
	 * another command is needed */
	while (player->upkeep->playing) {
		process_player();
		if (player->upkeep->energy_use)
			break;
		else
			return;
	}

	/* The player may still have enough energy to move, so we run another
	 * player turn before processing the rest of the world */
	while (player->energy >= z_info->move_energy) {
		/* Do any necessary animations */
		event_signal(EVENT_ANIMATE);
		
		/* Process monster with even more energy first */
		process_monsters(player->energy + 1);
		if (player->is_dead || !player->upkeep->playing ||
			player->upkeep->generate_level)
			break;

		/* Process the player until they use some energy */
		while (player->upkeep->playing) {
			process_player();
			if (player->upkeep->energy_use)
				break;
			else
				return;
		}
	}

	/* Now that the player's turn is fully complete, we run the main loop 
	 * until player input is needed again */
	while (true) {
		notice_stuff(player);
		handle_stuff(player);
		event_signal(EVENT_REFRESH);

		/* Process the rest of the world, give the player energy and 
		 * increment the turn counter unless we need to stop playing or
		 * generate a new level */
		if (player->is_dead || !player->upkeep->playing)
			return;
		else if (!player->upkeep->generate_level) {
			/* Process the rest of the monsters */
			process_monsters(0);

			/* Mark all monsters as ready to act when they have the energy */
			reset_monsters();

			/* Refresh */
			notice_stuff(player);
			handle_stuff(player);
			event_signal(EVENT_REFRESH);
			if (player->is_dead || !player->upkeep->playing)
				return;

			/* Process the world every ten turns */
			if (!(turn % 10) && !player->upkeep->generate_level) {
				process_world(cave);

				/* Refresh */
				notice_stuff(player);
				handle_stuff(player);
				event_signal(EVENT_REFRESH);
				if (player->is_dead || !player->upkeep->playing)
					return;
			}

			/* Give the player some energy */
			player->energy += turn_energy(player->state.speed);

			/* Count game turns */
			turn++;
		}

		/* Make a new level if requested */
		if (player->upkeep->generate_level) {
			bool arena = false;
			if (character_dungeon) {
				on_leave_level();
				if (cave->name && streq(cave->name, "arena")) {
					arena = true;
				}
			}

			prepare_next_level(player);
			on_new_level();

			player->upkeep->generate_level = false;

			/* Kill arena monster */
			if (arena) {
				player->upkeep->arena_level = false;
				if (player->upkeep->health_who) {
					kill_arena_monster(player->upkeep->health_who);
				}
			}
		}

		/* If the player has enough energy to move they now do so, after
		 * any monsters with more energy take their turns */
		while (player->energy >= z_info->move_energy) {
			/* Do any necessary animations */
			event_signal(EVENT_ANIMATE);

			/* Process monster with even more energy first */
			process_monsters(player->energy + 1);
			if (player->is_dead || !player->upkeep->playing ||
				player->upkeep->generate_level)
				break;

			/* Process the player until they use some energy */
			while (player->upkeep->playing) {
				process_player();
				if (player->upkeep->energy_use)
					break;
				else
					return;
			}
		}
	}
}